

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

UTrie2 * utrie2_openFromSerialized_63
                   (UTrie2ValueBits valueBits,void *data,int32_t length,int32_t *pActualLength,
                   UErrorCode *pErrorCode)

{
  uint32_t *puVar1;
  uint uVar2;
  UBool UVar3;
  int iVar4;
  UTrie2 *trie;
  UTrie2 tempTrie;
  int32_t actualLength;
  uint16_t *p16;
  UTrie2Header *header;
  UErrorCode *pErrorCode_local;
  int32_t *pActualLength_local;
  int32_t length_local;
  void *data_local;
  UTrie2 *pUStack_10;
  UTrie2ValueBits valueBits_local;
  
  UVar3 = U_FAILURE(*pErrorCode);
  if (UVar3 == '\0') {
    if ((((length < 1) || (((ulong)data & 3) != 0)) || ((int)valueBits < 0)) || (1 < (int)valueBits)
       ) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      pUStack_10 = (UTrie2 *)0x0;
    }
    else if (length < 0x10) {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      pUStack_10 = (UTrie2 *)0x0;
    }
    else if (*data == 0x54726932) {
      if (valueBits == (*(ushort *)((long)data + 4) & 0xf)) {
        memset(&trie,0,0x50);
        tempTrie.data32._0_4_ = (uint)*(ushort *)((long)data + 6);
        uVar2 = (uint)*(ushort *)((long)data + 8);
        tempTrie.data32._4_4_ = uVar2 * 4;
        tempTrie.indexLength._0_2_ = *(undefined2 *)((long)data + 10);
        tempTrie.indexLength._2_2_ = *(undefined2 *)((long)data + 0xc);
        tempTrie.initialValue = (uint)*(ushort *)((long)data + 0xe) << 0xb;
        tempTrie.errorValue = tempTrie.data32._4_4_ - 4;
        if (valueBits == UTRIE2_16_VALUE_BITS) {
          tempTrie.errorValue = (uint)tempTrie.data32 + tempTrie.errorValue;
        }
        if (valueBits == UTRIE2_16_VALUE_BITS) {
          iVar4 = uVar2 * 8;
        }
        else {
          iVar4 = uVar2 * 0x10;
        }
        tempTrie.newTrie._4_4_ = iVar4 + (uint)tempTrie.data32 * 2 + 0x10;
        if (length < tempTrie.newTrie._4_4_) {
          *pErrorCode = U_INVALID_FORMAT_ERROR;
          pUStack_10 = (UTrie2 *)0x0;
        }
        else {
          pUStack_10 = (UTrie2 *)uprv_malloc_63(0x50);
          if (pUStack_10 == (UTrie2 *)0x0) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            pUStack_10 = (UTrie2 *)0x0;
          }
          else {
            *(void **)&pUStack_10->length = tempTrie.memory;
            pUStack_10->newTrie = (UNewTrie2 *)tempTrie._64_8_;
            *(ulong *)&pUStack_10->highValueIndex = CONCAT44(tempTrie.highStart,tempTrie.errorValue)
            ;
            pUStack_10->memory = (void *)tempTrie._48_8_;
            pUStack_10->index2NullOffset = (undefined2)tempTrie.indexLength;
            pUStack_10->dataNullOffset = tempTrie.indexLength._2_2_;
            pUStack_10->initialValue = tempTrie.dataLength;
            pUStack_10->errorValue = tempTrie._32_4_;
            pUStack_10->highStart = tempTrie.initialValue;
            pUStack_10->data32 = (uint32_t *)tempTrie.data16;
            pUStack_10->indexLength = (uint)tempTrie.data32;
            pUStack_10->dataLength = tempTrie.data32._4_4_;
            pUStack_10->index = (uint16_t *)trie;
            pUStack_10->data16 = tempTrie.index;
            pUStack_10->memory = data;
            pUStack_10->length = tempTrie.newTrie._4_4_;
            pUStack_10->isMemoryOwned = '\0';
            pUStack_10->index = (uint16_t *)((long)data + 0x10);
            puVar1 = (uint32_t *)((uint16_t *)((long)data + 0x10) + pUStack_10->indexLength);
            if (valueBits == UTRIE2_16_VALUE_BITS) {
              pUStack_10->data16 = (uint16_t *)puVar1;
              pUStack_10->data32 = (uint32_t *)0x0;
              pUStack_10->initialValue = (uint)pUStack_10->index[pUStack_10->dataNullOffset];
              pUStack_10->errorValue = (uint)pUStack_10->data16[0x80];
            }
            else {
              if (valueBits != UTRIE2_32_VALUE_BITS) {
                *pErrorCode = U_INVALID_FORMAT_ERROR;
                return (UTrie2 *)0x0;
              }
              pUStack_10->data16 = (uint16_t *)0x0;
              pUStack_10->data32 = puVar1;
              pUStack_10->initialValue = pUStack_10->data32[pUStack_10->dataNullOffset];
              pUStack_10->errorValue = pUStack_10->data32[0x80];
            }
            if (pActualLength != (int32_t *)0x0) {
              *pActualLength = tempTrie.newTrie._4_4_;
            }
          }
        }
      }
      else {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
        pUStack_10 = (UTrie2 *)0x0;
      }
    }
    else {
      *pErrorCode = U_INVALID_FORMAT_ERROR;
      pUStack_10 = (UTrie2 *)0x0;
    }
  }
  else {
    pUStack_10 = (UTrie2 *)0x0;
  }
  return pUStack_10;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_openFromSerialized(UTrie2ValueBits valueBits,
                          const void *data, int32_t length, int32_t *pActualLength,
                          UErrorCode *pErrorCode) {
    const UTrie2Header *header;
    const uint16_t *p16;
    int32_t actualLength;

    UTrie2 tempTrie;
    UTrie2 *trie;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( length<=0 || (U_POINTER_MASK_LSB(data, 3)!=0) ||
        valueBits<0 || UTRIE2_COUNT_VALUE_BITS<=valueBits
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* enough data for a trie header? */
    if(length<(int32_t)sizeof(UTrie2Header)) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* check the signature */
    header=(const UTrie2Header *)data;
    if(header->signature!=UTRIE2_SIG) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* get the options */
    if(valueBits!=(UTrie2ValueBits)(header->options&UTRIE2_OPTIONS_VALUE_BITS_MASK)) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    /* get the length values and offsets */
    uprv_memset(&tempTrie, 0, sizeof(tempTrie));
    tempTrie.indexLength=header->indexLength;
    tempTrie.dataLength=header->shiftedDataLength<<UTRIE2_INDEX_SHIFT;
    tempTrie.index2NullOffset=header->index2NullOffset;
    tempTrie.dataNullOffset=header->dataNullOffset;

    tempTrie.highStart=header->shiftedHighStart<<UTRIE2_SHIFT_1;
    tempTrie.highValueIndex=tempTrie.dataLength-UTRIE2_DATA_GRANULARITY;
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        tempTrie.highValueIndex+=tempTrie.indexLength;
    }

    /* calculate the actual length */
    actualLength=(int32_t)sizeof(UTrie2Header)+tempTrie.indexLength*2;
    if(valueBits==UTRIE2_16_VALUE_BITS) {
        actualLength+=tempTrie.dataLength*2;
    } else {
        actualLength+=tempTrie.dataLength*4;
    }
    if(length<actualLength) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;  /* not enough bytes */
        return 0;
    }

    /* allocate the trie */
    trie=(UTrie2 *)uprv_malloc(sizeof(UTrie2));
    if(trie==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    uprv_memcpy(trie, &tempTrie, sizeof(tempTrie));
    trie->memory=(uint32_t *)data;
    trie->length=actualLength;
    trie->isMemoryOwned=FALSE;
#ifdef UTRIE2_DEBUG
    trie->name="fromSerialized";
#endif

    /* set the pointers to its index and data arrays */
    p16=(const uint16_t *)(header+1);
    trie->index=p16;
    p16+=trie->indexLength;

    /* get the data */
    switch(valueBits) {
    case UTRIE2_16_VALUE_BITS:
        trie->data16=p16;
        trie->data32=NULL;
        trie->initialValue=trie->index[trie->dataNullOffset];
        trie->errorValue=trie->data16[UTRIE2_BAD_UTF8_DATA_OFFSET];
        break;
    case UTRIE2_32_VALUE_BITS:
        trie->data16=NULL;
        trie->data32=(const uint32_t *)p16;
        trie->initialValue=trie->data32[trie->dataNullOffset];
        trie->errorValue=trie->data32[UTRIE2_BAD_UTF8_DATA_OFFSET];
        break;
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(pActualLength!=NULL) {
        *pActualLength=actualLength;
    }
    return trie;
}